

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

UVector * __thiscall
icu_63::TimeZoneNames::MatchInfoCollection::matches(MatchInfoCollection *this,UErrorCode *status)

{
  UBool UVar1;
  UVector *this_00;
  UErrorCode *size;
  UVector *local_50;
  UErrorCode *status_local;
  MatchInfoCollection *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fMatches == (UVector *)0x0) {
      this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      local_50 = (UVector *)0x0;
      if (this_00 != (UVector *)0x0) {
        UVector::UVector(this_00,deleteMatchInfo,(UElementsAreEqual *)0x0,status);
        local_50 = this_00;
      }
      this->fMatches = local_50;
      if (this->fMatches == (UVector *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 != '\0') {
          if (this->fMatches != (UVector *)0x0) {
            (*(this->fMatches->super_UObject)._vptr_UObject[1])();
          }
          this->fMatches = (UVector *)0x0;
        }
      }
      this_local = (MatchInfoCollection *)this->fMatches;
    }
    else {
      this_local = (MatchInfoCollection *)this->fMatches;
    }
  }
  else {
    this_local = (MatchInfoCollection *)0x0;
  }
  return (UVector *)this_local;
}

Assistant:

UVector*
TimeZoneNames::MatchInfoCollection::matches(UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    if (fMatches != NULL) {
        return fMatches;
    }
    fMatches = new UVector(deleteMatchInfo, NULL, status);
    if (fMatches == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else if (U_FAILURE(status)) {
        delete fMatches;
        fMatches = NULL;
    }
    return fMatches;
}